

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

double bicubic_interp_one(double *arr,int stride,double *h_kernel,double *v_kernel)

{
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar1;
  int i;
  double tmp [4];
  int local_4c;
  double local_48 [5];
  double *local_20;
  double *local_18;
  int local_c;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_4c = -1; local_4c < 3; local_4c = local_4c + 1) {
    dVar1 = get_cubic_value_dbl((double *)(local_8 + (long)(local_4c * local_c + -1) * 8),local_18);
    local_48[local_4c + 1] = dVar1;
  }
  dVar1 = get_cubic_value_dbl(local_48,local_20);
  return dVar1;
}

Assistant:

static inline double bicubic_interp_one(const double *arr, int stride,
                                        const double h_kernel[4],
                                        const double v_kernel[4]) {
  double tmp[1 * 4];

  // Horizontal convolution
  for (int i = -1; i < 3; ++i) {
    tmp[i + 1] = get_cubic_value_dbl(&arr[i * stride - 1], h_kernel);
  }

  // Vertical convolution
  return get_cubic_value_dbl(tmp, v_kernel);
}